

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_checkpoint_state.cpp
# Opt level: O3

void __thiscall
duckdb::PartialBlockForCheckpoint::Merge
          (PartialBlockForCheckpoint *this,PartialBlock *other_p,idx_t offset,idx_t other_size)

{
  pointer *ppUVar1;
  BufferManager *pBVar2;
  data_ptr_t pdVar3;
  pointer pUVar4;
  iterator __position;
  _func_int **pp_Var5;
  ColumnData *__args;
  ColumnSegment *__args_1;
  idx_t iVar6;
  PartialColumnSegment *segment;
  _func_int **pp_Var7;
  pointer __args_00;
  BufferHandle new_handle;
  BufferHandle old_handle;
  uint local_7c;
  PartialBlock *local_78;
  undefined8 uStack_70;
  BufferHandle local_60;
  BufferHandle local_48;
  
  pBVar2 = ((this->super_PartialBlock).block_manager)->buffer_manager;
  (*pBVar2->_vptr_BufferManager[7])(&local_48,pBVar2,&other_p->block_handle);
  (*pBVar2->_vptr_BufferManager[7])(&local_60,pBVar2,&(this->super_PartialBlock).block_handle);
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&local_60.node);
  pdVar3 = (local_60.node.ptr)->buffer;
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&local_48.node);
  switchD_012b9b0d::default(pdVar3 + offset,(local_48.node.ptr)->buffer,other_size);
  __args_00 = (other_p->uninitialized_regions).
              super_vector<duckdb::UninitializedRegion,_std::allocator<duckdb::UninitializedRegion>_>
              .
              super__Vector_base<duckdb::UninitializedRegion,_std::allocator<duckdb::UninitializedRegion>_>
              ._M_impl.super__Vector_impl_data._M_start;
  pUVar4 = (other_p->uninitialized_regions).
           super_vector<duckdb::UninitializedRegion,_std::allocator<duckdb::UninitializedRegion>_>.
           super__Vector_base<duckdb::UninitializedRegion,_std::allocator<duckdb::UninitializedRegion>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (__args_00 != pUVar4) {
    local_78 = (PartialBlock *)offset;
    uStack_70 = offset;
    do {
      __args_00->start = __args_00->start + (long)local_78;
      __args_00->end = __args_00->end + uStack_70;
      __position._M_current =
           (this->super_PartialBlock).uninitialized_regions.
           super_vector<duckdb::UninitializedRegion,_std::allocator<duckdb::UninitializedRegion>_>.
           super__Vector_base<duckdb::UninitializedRegion,_std::allocator<duckdb::UninitializedRegion>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->super_PartialBlock).uninitialized_regions.
          super_vector<duckdb::UninitializedRegion,_std::allocator<duckdb::UninitializedRegion>_>.
          super__Vector_base<duckdb::UninitializedRegion,_std::allocator<duckdb::UninitializedRegion>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<duckdb::UninitializedRegion,std::allocator<duckdb::UninitializedRegion>>::
        _M_realloc_insert<duckdb::UninitializedRegion_const&>
                  ((vector<duckdb::UninitializedRegion,std::allocator<duckdb::UninitializedRegion>>
                    *)&(this->super_PartialBlock).uninitialized_regions,__position,__args_00);
      }
      else {
        iVar6 = __args_00->end;
        (__position._M_current)->start = __args_00->start;
        (__position._M_current)->end = iVar6;
        ppUVar1 = &(this->super_PartialBlock).uninitialized_regions.
                   super_vector<duckdb::UninitializedRegion,_std::allocator<duckdb::UninitializedRegion>_>
                   .
                   super__Vector_base<duckdb::UninitializedRegion,_std::allocator<duckdb::UninitializedRegion>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppUVar1 = *ppUVar1 + 1;
      }
      __args_00 = __args_00 + 1;
    } while (__args_00 != pUVar4);
  }
  pp_Var7 = other_p[1]._vptr_PartialBlock;
  pp_Var5 = (_func_int **)other_p[1].state.block_id;
  local_78 = other_p;
  if (pp_Var7 != pp_Var5) {
    do {
      __args = (ColumnData *)*pp_Var7;
      __args_1 = (ColumnSegment *)pp_Var7[1];
      local_7c = NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert
                           (*(uint *)(pp_Var7 + 2) + offset);
      ::std::
      vector<duckdb::PartialBlockForCheckpoint::PartialColumnSegment,std::allocator<duckdb::PartialBlockForCheckpoint::PartialColumnSegment>>
      ::emplace_back<duckdb::ColumnData&,duckdb::ColumnSegment&,unsigned_int&>
                ((vector<duckdb::PartialBlockForCheckpoint::PartialColumnSegment,std::allocator<duckdb::PartialBlockForCheckpoint::PartialColumnSegment>>
                  *)&this->segments,__args,__args_1,&local_7c);
      pp_Var7 = pp_Var7 + 3;
    } while (pp_Var7 != pp_Var5);
  }
  (*local_78->_vptr_PartialBlock[4])();
  BufferHandle::~BufferHandle(&local_60);
  BufferHandle::~BufferHandle(&local_48);
  return;
}

Assistant:

void PartialBlockForCheckpoint::Merge(PartialBlock &other_p, idx_t offset, idx_t other_size) {
	auto &other = other_p.Cast<PartialBlockForCheckpoint>();

	auto &buffer_manager = block_manager.buffer_manager;
	// pin the source block
	auto old_handle = buffer_manager.Pin(other.block_handle);
	// pin the target block
	auto new_handle = buffer_manager.Pin(block_handle);
	// memcpy the contents of the old block to the new block
	memcpy(new_handle.Ptr() + offset, old_handle.Ptr(), other_size);

	// now copy over all segments to the new block
	// move over the uninitialized regions
	for (auto &region : other.uninitialized_regions) {
		region.start += offset;
		region.end += offset;
		uninitialized_regions.push_back(region);
	}

	// move over the segments
	for (auto &segment : other.segments) {
		AddSegmentToTail(segment.data, segment.segment, NumericCast<uint32_t>(segment.offset_in_block + offset));
	}

	other.Clear();
}